

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Intermediate.cpp
# Opt level: O2

TIntermConstantUnion * __thiscall
glslang::TIntermediate::addConstantUnion(TIntermediate *this,uint u,TSourceLoc *loc,bool literal)

{
  pointer pTVar1;
  TIntermConstantUnion *pTVar2;
  TIntermediate *this_00;
  TConstUnionArray unionArray;
  
  TConstUnionArray::TConstUnionArray(&unionArray,1);
  pTVar1 = ((unionArray.unionArray)->
           super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
           super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>.
           _M_impl.super__Vector_impl_data._M_start;
  (pTVar1->field_0).uConst = u;
  pTVar1->type = EbtUint;
  this_00 = (TIntermediate *)&stack0xffffffffffffff38;
  TType::TType((TType *)&stack0xffffffffffffff38,EbtUint,EvqConst,1,0,0,false);
  pTVar2 = addConstantUnion(this_00,&unionArray,(TType *)&stack0xffffffffffffff38,loc,literal);
  return pTVar2;
}

Assistant:

TIntermConstantUnion* TIntermediate::addConstantUnion(unsigned int u, const TSourceLoc& loc, bool literal) const
{
    TConstUnionArray unionArray(1);
    unionArray[0].setUConst(u);

    return addConstantUnion(unionArray, TType(EbtUint, EvqConst), loc, literal);
}